

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O0

button_state * button_state_create(xcb_connection_t *connection)

{
  toggle_modifiers *ptVar1;
  button_state *state;
  xcb_connection_t *connection_local;
  
  connection_local = (xcb_connection_t *)malloc(0x28);
  if (connection_local == (xcb_connection_t *)0x0) {
    connection_local = (xcb_connection_t *)0x0;
  }
  else {
    ptVar1 = resolve_toggle_modifiers(connection);
    *(toggle_modifiers **)connection_local = ptVar1;
    if (*(long *)connection_local == 0) {
      internal_logger(natwm_logger,LEVEL_WARNING,
                      "Failed to resolve toggleable modifier keys! This may cause issues");
    }
    *(long *)(connection_local + 8) = 0;
    *(undefined4 *)(connection_local + 0x10) = 0;
  }
  return (button_state *)connection_local;
}

Assistant:

struct button_state *button_state_create(xcb_connection_t *connection)
{
        struct button_state *state = malloc(sizeof(struct button_state));

        if (state == NULL) {
                return NULL;
        }

        state->modifiers = resolve_toggle_modifiers(connection);

        if (state->modifiers == NULL) {
                LOG_WARNING(natwm_logger,
                            "Failed to resolve toggleable modifier keys! This may cause issues");
        }

        state->grabbed_client = NULL;
        state->resize_helper = XCB_NONE;

        return state;
}